

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::Validator::OnReturnCallIndirectExpr
          (Validator *this,ReturnCallIndirectExpr *expr)

{
  Var local_b8;
  Var local_70;
  Enum local_24;
  ReturnCallIndirectExpr *local_20;
  ReturnCallIndirectExpr *expr_local;
  Validator *this_local;
  
  local_20 = expr;
  expr_local = (ReturnCallIndirectExpr *)this;
  GetFuncTypeIndex(&local_70,this,&(expr->super_ExprMixin<(wabt::ExprType)41>).super_Expr.loc,
                   &expr->decl);
  Var::Var(&local_b8,&local_20->table);
  local_24 = (Enum)SharedValidator::OnReturnCallIndirect
                             (&this->validator_,
                              &(expr->super_ExprMixin<(wabt::ExprType)41>).super_Expr.loc,&local_70,
                              &local_b8);
  Result::operator|=(&this->result_,(Result)local_24);
  Var::~Var(&local_b8);
  Var::~Var(&local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnReturnCallIndirectExpr(ReturnCallIndirectExpr* expr) {
  result_ |= validator_.OnReturnCallIndirect(
      expr->loc, GetFuncTypeIndex(expr->loc, expr->decl), expr->table);
  return Result::Ok;
}